

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  _Hash_node_base *p_Var1;
  pointer pOVar2;
  bool bVar3;
  uint32_t uVar4;
  _Type member_idx;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  undefined1 local_48 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_28;
  
  if ((inst->opcode_ != OpMemberName) && (inst->opcode_ != OpMemberDecorate)) {
    __assert_fail("inst->opcode() == spv::Op::OpMemberName || inst->opcode() == spv::Op::OpMemberDecorate"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x16e,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate(Instruction *)"
                 );
  }
  uVar4 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar4 = (uint)inst->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(inst,uVar4);
  uVar5 = (this->used_members_)._M_h._M_bucket_count;
  uVar6 = (ulong)uVar4 % uVar5;
  p_Var8 = (this->used_members_)._M_h._M_buckets[uVar6];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var8->_M_nxt, p_Var9 = p_Var8, uVar4 != *(uint32_t *)&p_Var8->_M_nxt[1]._M_nxt)) {
    while (p_Var8 = p_Var1, p_Var1 = p_Var8->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var1[1]._M_nxt % uVar5 != uVar6) ||
         (p_Var9 = p_Var8, uVar4 == *(uint *)&p_Var1[1]._M_nxt)) goto LAB_00205323;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00205323:
  if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
LAB_00205363:
    bVar3 = false;
  }
  else {
    uVar7 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar7 = (uint)inst->has_result_id_;
    }
    member_idx = (_Type)Instruction::GetSingleWordOperand(inst,uVar7 + 1);
    local_48._16_4_ = GetNewMemberIndex(this,uVar4,(uint32_t)member_idx);
    if ((_Type)local_48._16_4_ == (_Type)0xffffffff) {
      IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst);
    }
    else {
      if ((_Type)local_48._16_4_ == member_idx) goto LAB_00205363;
      local_48._24_8_ = local_48 + 0x10;
      local_48._0_8_ = &PTR__SmallVector_003e9b28;
      local_28._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_48._8_8_ = 1;
      uVar5 = (ulong)(inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar5 = (ulong)inst->has_result_id_;
      }
      uVar5 = uVar5 + 1;
      pOVar2 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
              -0x5555555555555555;
      if (uVar6 < uVar5 || uVar6 - uVar5 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar5 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_48);
      local_48._0_8_ = &PTR__SmallVector_003e9b28;
      if (local_28._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_28,local_28._M_head_impl);
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpMemberName ||
         inst->opcode() == spv::Op::OpMemberDecorate);

  uint32_t type_id = inst->GetSingleWordInOperand(0);
  auto live_members = used_members_.find(type_id);
  if (live_members == used_members_.end()) {
    return false;
  }

  uint32_t orig_member_idx = inst->GetSingleWordInOperand(1);
  uint32_t new_member_idx = GetNewMemberIndex(type_id, orig_member_idx);

  if (new_member_idx == kRemovedMember) {
    context()->KillInst(inst);
    return true;
  }

  if (new_member_idx == orig_member_idx) {
    return false;
  }

  inst->SetInOperand(1, {new_member_idx});
  return true;
}